

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_interpolation_21(void)

{
  run("dotted names should be functional to any level of nesting",
      "\"{{a.b.c.d.e.name}}\" == \"Phil\"",
      "{\"a\": {\"b\": {\"c\": {\"d\": {\"e\": {\"name\": \"Phil\"}}}}}}",(char *)0x0,
      "\"Phil\" == \"Phil\"");
  return;
}

Assistant:

static void
test_interpolation_21(void)
{
    run(
        "dotted names should be functional to any level of nesting",
        "\"{{a.b.c.d.e.name}}\" == \"Phil\"",
        "{\"a\": {\"b\": {\"c\": {\"d\": {\"e\": {\"name\": \"Phil\"}}}}}}",
        NULL,
        "\"Phil\" == \"Phil\""
    );
}